

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

int __thiscall
gl4cts::ClipControlRenderBaseTest::init(ClipControlRenderBaseTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Functions *gl;
  GLuint viewportH;
  GLuint viewportW;
  RenderTarget *renderTarget;
  ClipControlRenderBaseTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_ClipControlBaseTest).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  iVar1 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar1));
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_ClipControlBaseTest).super_TestCase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var_00,iVar3);
  (**(code **)(lVar5 + 0x6d0))(1,&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar5 + 0x6e8))(1,&this->m_rboC);
  (**(code **)(lVar5 + 0x6e8))(1,&this->m_rboD);
  (**(code **)(lVar5 + 0xa0))(0x8d41,this->m_rboC);
  (**(code **)(lVar5 + 0x1238))(0x8d41,0x8058,iVar2,iVar1);
  (**(code **)(lVar5 + 0xa0))(0x8d41,this->m_rboD);
  (**(code **)(lVar5 + 0x1238))(0x8d41,0x81a6,iVar2,iVar1);
  (**(code **)(lVar5 + 0x78))(0x8d40,*(undefined4 *)&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar5 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rboC);
  iVar1 = (**(code **)(lVar5 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_rboD);
  return iVar1;
}

Assistant:

virtual void init(void)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();

		gl.genFramebuffers(1, &m_fbo);
		gl.genRenderbuffers(1, &m_rboC);
		gl.genRenderbuffers(1, &m_rboD);

		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rboC);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, viewportW, viewportH);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rboD);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, viewportW, viewportH);

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rboC);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rboD);
	}